

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 subFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  int iVar1;
  undefined1 auVar2 [12];
  ulong uVar3;
  uint64_t zSig0;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  floatx80 fVar11;
  
  uVar8 = a._8_8_;
  uVar3 = a.low;
  uVar7 = b.low;
  uVar10 = a._8_4_ & 0x7fff;
  uVar6 = b._8_4_ & 0x7fff;
  iVar9 = uVar10 - uVar6;
  if (iVar9 == 0 || uVar10 < uVar6) {
    if (iVar9 < 0) {
      if (uVar6 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          uVar8 = (ulong)((uint)(byte)~zSign << 0xf | 0x7fff);
          uVar3 = 0x8000000000000000;
          goto LAB_00cf8313;
        }
        goto LAB_00cf81c8;
      }
      iVar1 = -(uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0);
      uVar10 = iVar1 - iVar9;
      if (uVar10 == 0) goto LAB_00cf82e6;
      bVar5 = -((char)iVar1 - (char)iVar9) & 0x3f;
      if (uVar10 < 0x40) {
        uVar4 = uVar3 >> ((byte)uVar10 & 0x3f);
        uVar8 = uVar3 << bVar5;
      }
      else if (uVar10 == 0x40) {
        uVar4 = 0;
        uVar8 = uVar3;
      }
      else {
        if (uVar10 < 0x80) {
          uVar8 = (ulong)(uVar3 << bVar5 != 0) | uVar3 >> ((byte)uVar10 & 0x3f);
        }
        else {
          uVar8 = (ulong)(uVar3 != 0);
        }
        uVar4 = 0;
      }
    }
    else {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
        uVar10 = 1;
        uVar6 = 1;
      }
      else if (uVar10 == 0x7fff) {
        if (((uVar7 | uVar3) & 0x7fffffffffffffff) == 0) {
          status->float_exception_flags = status->float_exception_flags | 1;
          uVar8 = CONCAT62(a._10_6_,0xffff);
          uVar3 = 0xc000000000000000;
          goto LAB_00cf8313;
        }
        goto LAB_00cf81c8;
      }
      if (uVar7 < uVar3) goto LAB_00cf829e;
      if (uVar7 <= uVar3) {
        uVar8 = (ulong)(status->float_rounding_mode == '\x01') << 0xf;
        uVar3 = 0;
        goto LAB_00cf8313;
      }
LAB_00cf82e6:
      uVar8 = 0;
      uVar4 = uVar3;
    }
    zSig0 = (uVar7 - uVar4) + -1 + (ulong)(uVar8 == 0);
    zSign = zSign ^ 1;
LAB_00cf82fa:
    fVar11 = normalizeRoundAndPackFloatx80_tricore
                       (status->floatx80_rounding_precision,zSign,uVar6,zSig0,-uVar8,status);
    auVar2 = fVar11._0_12_;
  }
  else {
    if (uVar10 != 0x7fff) {
      uVar6 = iVar9 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) ==
                            (undefined1  [16])0x0);
      if (uVar6 == 0) {
LAB_00cf829e:
        uVar8 = 0;
        uVar4 = uVar7;
      }
      else {
        bVar5 = (byte)uVar6;
        if (uVar6 < 0x40) {
          uVar4 = uVar7 >> (bVar5 & 0x3f);
          uVar8 = uVar7 << (-bVar5 & 0x3f);
        }
        else if (uVar6 == 0x40) {
          uVar4 = 0;
          uVar8 = uVar7;
        }
        else {
          if (uVar6 < 0x80) {
            uVar8 = (ulong)(uVar7 << (-bVar5 & 0x3f) != 0) | uVar7 >> (bVar5 & 0x3f);
          }
          else {
            uVar8 = (ulong)(uVar7 != 0);
          }
          uVar4 = 0;
        }
      }
      zSig0 = (uVar3 - uVar4) + -1 + (ulong)(uVar8 == 0);
      uVar6 = uVar10;
      goto LAB_00cf82fa;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
    goto LAB_00cf8313;
LAB_00cf81c8:
    fVar11 = propagateFloatx80NaN_tricore(a,b,status);
    auVar2 = fVar11._0_12_;
  }
  uVar3 = auVar2._0_8_;
  uVar8 = (ulong)auVar2._8_4_;
LAB_00cf8313:
  fVar11._8_8_ = uVar8 & 0xffffffff;
  fVar11.low = uVar3;
  return fVar11;
}

Assistant:

static floatx80 subFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    zSig1 = 0;
    if ( bSig < aSig ) goto aBigger;
    if ( aSig < bSig ) goto bBigger;
    return packFloatx80(status->float_rounding_mode == float_round_down, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80(zSign ^ 1, floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) ++expDiff;
    shift128RightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
 bBigger:
    sub128( bSig, 0, aSig, zSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) --expDiff;
    shift128RightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
 aBigger:
    sub128( aSig, 0, bSig, zSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    return normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                         zSign, zExp, zSig0, zSig1, status);
}